

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O3

void __thiscall avro::NodeFixed::printJson(NodeFixed *this,ostream *os,int depth)

{
  indent x;
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{\n",2);
  x.d = depth + 1;
  operator<<(os,x);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"type\": \"fixed\",\n",0x11);
  printName(os,&(this->super_NodeImplFixed).nameAttribute_.attr_,x.d);
  operator<<(os,x);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"size\": ",8);
  poVar1 = (ostream *)std::ostream::operator<<(os,(this->super_NodeImplFixed).sizeAttribute_.attr_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  operator<<(os,(indent)depth);
  uStack_28 = CONCAT17(0x7d,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void 
NodeFixed::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(++depth) << "\"type\": \"fixed\",\n";
    printName(os, nameAttribute_.get(), depth);
    os << indent(depth) << "\"size\": " << sizeAttribute_.get() << "\n";
    os << indent(--depth) << '}';
}